

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_356634::ArgParser::argCopyright(ArgParser *this)

{
  Pipeline *pPVar1;
  Pipeline *this_00;
  string *str;
  QPDFLogger local_50;
  bool local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string local_30;
  
  QPDFLogger::defaultLogger();
  QPDFLogger::getInfo(&local_50,local_40);
  QPDFArgParser::getProgname_abi_cxx11_(&local_30,&this->ap);
  pPVar1 = Pipeline::operator<<
                     ((Pipeline *)
                      local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_30);
  this_00 = Pipeline::operator<<(pPVar1," version ");
  str = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)pPVar1);
  pPVar1 = Pipeline::operator<<(this_00,str);
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"Copyright (c) 2005-2021 Jay Berkenbilt\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"Copyright (c) 2022-2025 Jay Berkenbilt and Manfred Holger\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,
                      "qpdf is licensed under the Apache License, Version 2.0 (the \"License\");\n")
  ;
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"you may not use this file except in compliance with the License.\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"You may obtain a copy of the License at\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"  http://www.apache.org/licenses/LICENSE-2.0\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"Unless required by applicable law or agreed to in writing, software\n"
                     );
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"distributed under the License is distributed on an \"AS IS\" BASIS,\n"
                     );
  pPVar1 = Pipeline::operator<<
                     (pPVar1,
                      "WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"See the License for the specific language governing permissions and\n"
                     );
  pPVar1 = Pipeline::operator<<(pPVar1,"limitations under the License.\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"Versions of qpdf prior to version 7 were released under the terms\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"of version 2.0 of the Artistic License. At your option, you may\n");
  pPVar1 = Pipeline::operator<<
                     (pPVar1,"continue to consider qpdf to be licensed under those terms. Please\n")
  ;
  Pipeline::operator<<(pPVar1,"see the manual for additional information.\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void
ArgParser::argCopyright()
{
    // clang-format off
    // Make sure the output looks right on an 80-column display.
    //               1         2         3         4         5         6         7         8
    //      12345678901234567890123456789012345678901234567890123456789012345678901234567890
    *QPDFLogger::defaultLogger()->getInfo()
        << this->ap.getProgname()
        << " version " << QPDF::QPDFVersion() << "\n"
        << "\n"
        << "Copyright (c) 2005-2021 Jay Berkenbilt\n"
        << "Copyright (c) 2022-2025 Jay Berkenbilt and Manfred Holger\n"
        << "\n"
        << "qpdf is licensed under the Apache License, Version 2.0 (the \"License\");\n"
        << "you may not use this file except in compliance with the License.\n"
        << "You may obtain a copy of the License at\n"
        << "\n"
        << "  http://www.apache.org/licenses/LICENSE-2.0\n"
        << "\n"
        << "Unless required by applicable law or agreed to in writing, software\n"
        << "distributed under the License is distributed on an \"AS IS\" BASIS,\n"
        << "WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n"
        << "See the License for the specific language governing permissions and\n"
        << "limitations under the License.\n"
        << "\n"
        << "Versions of qpdf prior to version 7 were released under the terms\n"
        << "of version 2.0 of the Artistic License. At your option, you may\n"
        << "continue to consider qpdf to be licensed under those terms. Please\n"
        << "see the manual for additional information.\n";
    // clang-format on
}